

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_candidate_index_impl.h
# Opt level: O3

void __thiscall
histo_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *label_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *degree_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *leaf_distance_histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  pointer ppVar1;
  iterator iVar2;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *pvVar3;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *pvVar4;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *pvVar5;
  long lVar6;
  pointer piVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  pointer ppVar10;
  ulong uVar11;
  pointer ppVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  iterator __end2;
  __node_base *p_Var16;
  _Hash_node_base *p_Var17;
  iterator __begin2;
  int *piVar18;
  int pre_cand_id;
  int current_tree_id;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  int local_b0;
  int local_ac;
  int *local_a8;
  iterator iStack_a0;
  int *local_98;
  double local_90;
  vector<int,_std::allocator<int>_> local_88;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_70;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_68;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_60;
  pointer local_58;
  CandidateIndex *local_50;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_48;
  
  local_90 = distance_threshold;
  local_50 = this;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&local_48,(long)(il_size + 1),(allocator_type *)&local_88);
  local_ac = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,
             (long)(label_histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(label_histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_a8);
  ppVar9 = (label_histogram_collection->
           super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (label_histogram_collection->
             super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates;
  pvVar4 = degree_histogram_collection;
  pvVar5 = leaf_distance_histogram_collection;
  if (ppVar9 != local_58) {
    do {
      local_60 = pvVar5;
      local_68 = pvVar4;
      local_70 = pvVar3;
      local_a8 = (int *)0x0;
      iStack_a0._M_current = (int *)0x0;
      local_98 = (int *)0x0;
      if (((double)ppVar9->first <= local_90) && (local_b0 = 0, 0 < local_ac)) {
        do {
          if (iStack_a0._M_current == local_98) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_b0);
          }
          else {
            *iStack_a0._M_current = local_b0;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_b0] =
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_b0] + 1;
          local_b0 = local_b0 + 1;
        } while (local_b0 < local_ac);
      }
      p_Var16 = &(ppVar9->second)._M_h._M_before_begin;
      while( true ) {
        join_candidates =
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70;
        iVar2._M_current = iStack_a0._M_current;
        p_Var16 = p_Var16->_M_nxt;
        if (p_Var16 == (__node_base *)0x0) break;
        lVar6 = (long)(int)*(size_type *)(p_Var16 + 1);
        ppVar12 = local_48.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar6].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar10 = local_48.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar6].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (ppVar12 != ppVar10) {
          do {
            iVar14 = *(int *)((long)(p_Var16 + 1) + 4);
            if (ppVar12->second < *(int *)((long)(p_Var16 + 1) + 4)) {
              iVar14 = ppVar12->second;
            }
            if ((piVar7[ppVar12->first] == 0) && (iVar14 != 0)) {
              if (iStack_a0._M_current == local_98) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&ppVar12->first);
                piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              else {
                *iStack_a0._M_current = ppVar12->first;
                iStack_a0._M_current = iStack_a0._M_current + 1;
              }
            }
            iVar13 = iVar14 + piVar7[ppVar12->first];
            if (ppVar9->first < iVar14 + piVar7[ppVar12->first]) {
              iVar13 = ppVar9->first;
            }
            piVar7[ppVar12->first] = iVar13;
            ppVar12 = ppVar12 + 1;
          } while (ppVar12 != ppVar10);
          lVar6 = (long)(int)*(size_type *)(p_Var16 + 1);
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   (local_48.
                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar6),&local_ac,
                   (int *)((long)(p_Var16 + 1) + 4));
      }
      local_50->pre_candidates_ =
           local_50->pre_candidates_ + ((long)iStack_a0._M_current - (long)local_a8 >> 2);
      piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      degree_histogram_collection = local_68;
      for (piVar18 = local_a8; local_68 = degree_histogram_collection, iVar2._M_current != piVar18;
          piVar18 = piVar18 + 1) {
        local_b0 = *piVar18;
        lVar6 = (long)local_b0;
        ppVar1 = (label_histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((double)((ppVar1[lVar6].first + ppVar1[local_ac].first + piVar7[lVar6] * -2) / 2) <=
            local_90) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     join_candidates,&local_ac,&local_b0);
          lVar6 = (long)local_b0;
          piVar7 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        piVar7[lVar6] = 0;
        degree_histogram_collection = local_68;
      }
      local_ac = local_ac + 1;
      if (local_a8 != (int *)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      ppVar9 = ppVar9 + 1;
      leaf_distance_histogram_collection = local_60;
      pvVar3 = local_70;
      pvVar4 = local_68;
      pvVar5 = local_60;
    } while (ppVar9 != local_58);
  }
  ppVar12 = *(pointer *)join_candidates;
  if (ppVar12 != *(pointer *)((long)join_candidates + 8)) {
    ppVar9 = (degree_histogram_collection->
             super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      lVar6 = (long)ppVar12->first;
      p_Var17 = ppVar9[lVar6].second._M_h._M_before_begin._M_nxt;
      iVar14 = 0;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          pmVar8 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&(degree_histogram_collection->
                                    super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[ppVar12->second].
                                    second,(key_type *)(p_Var17 + 1));
          iVar13 = *(int *)((long)&p_Var17[1]._M_nxt + 4);
          if (*pmVar8 < iVar13) {
            iVar13 = *pmVar8;
          }
          iVar14 = iVar14 + iVar13;
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        lVar6 = (long)ppVar12->first;
        ppVar9 = (degree_histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar14 = iVar14 * 2;
      }
      iVar13 = ppVar9[lVar6].first;
      iVar15 = ppVar9[ppVar12->second].first;
      if (local_90 < (double)(((iVar13 - iVar14) + iVar15) / 5)) break;
      p_Var17 = (leaf_distance_histogram_collection->
                super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar6].second._M_h._M_before_begin._M_nxt
      ;
      iVar14 = 0;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          pmVar8 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&(leaf_distance_histogram_collection->
                                    super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[ppVar12->second].
                                    second,(key_type *)(p_Var17 + 1));
          iVar13 = *(int *)((long)&p_Var17[1]._M_nxt + 4);
          if (*pmVar8 < iVar13) {
            iVar13 = *pmVar8;
          }
          iVar14 = iVar14 + iVar13;
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        ppVar9 = (degree_histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar15 = ppVar9[ppVar12->second].first;
        iVar13 = ppVar9[ppVar12->first].first;
        iVar14 = iVar14 * 2;
      }
      if (local_90 < (double)((iVar13 - iVar14) + iVar15)) {
        ppVar10 = *(pointer *)((long)join_candidates + 8);
        if ((ppVar12 + 1 != ppVar10) &&
           (lVar6 = (long)ppVar10 - (long)(ppVar12 + 1) >> 3, 0 < lVar6)) {
          uVar11 = lVar6 + 1;
          do {
            *ppVar12 = ppVar12[1];
            ppVar12 = ppVar12 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
        goto LAB_00106421;
      }
      ppVar12 = ppVar12 + 1;
      if (ppVar12 == *(pointer *)((long)join_candidates + 8)) goto LAB_00106429;
    }
    ppVar10 = *(pointer *)((long)join_candidates + 8);
    if ((ppVar12 + 1 != ppVar10) && (lVar6 = (long)ppVar10 - (long)(ppVar12 + 1) >> 3, 0 < lVar6)) {
      uVar11 = lVar6 + 1;
      do {
        *ppVar12 = ppVar12[1];
        ppVar12 = ppVar12 + 1;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
LAB_00106421:
    *(pointer *)((long)join_candidates + 8) = ppVar10 + -1;
  }
LAB_00106429:
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& label_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& degree_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& leaf_distance_histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(label_histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: label_histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    // get precandidates from the inverted list by looking up all elements
    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((label_histogram_collection[current_tree_id].first + label_histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }

  // apply degree and leaf distance lower bound for all candidates
  auto cand = std::begin(join_candidates);
  while(cand != std::end(join_candidates)) {
    // count degree intersection
    int intersection = 0;
    for(auto& element: degree_histogram_collection[cand->first].second)
      intersection += std::min(element.second, degree_histogram_collection[cand->second].second[element.first]);
    // remove pair if degree lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) / 5 > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    // count leaf distance intersection
    intersection = 0;
    for(auto& element: leaf_distance_histogram_collection[cand->first].second)
      intersection += std::min(element.second, leaf_distance_histogram_collection[cand->second].second[element.first]);
    // remove pair if leaf distance lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    cand++;
  }
}